

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void interpolatetest2(void)

{
  double *x;
  double dVar1;
  long lVar2;
  double dStack_88;
  double tablet [4];
  double tablei [4];
  double ylo;
  double yhi;
  int pos [4];
  
  x = tablet + 3;
  tablei[1] = 0.146;
  tablei[2] = 0.119;
  tablet[3] = 0.216;
  tablei[0] = 0.176;
  tablet[1] = 0.05;
  tablet[2] = 0.1;
  dStack_88 = 0.01;
  tablet[0] = 0.025;
  yhi = 0.0;
  pos[0] = 0;
  pos[1] = 0;
  arrayminmax(x,4,tablei + 3,&ylo);
  dVar1 = interpolate_linear(&dStack_88,x,4,0.059);
  printf("OUT %g \n",SUB84(dVar1,0));
  sort1d_ascending(x,4,(int *)&yhi);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    printf(" %d %g %g",SUB84(tablet[lVar2 + 3],0),tablet[(long)pos[lVar2 + -2] + 3]);
  }
  return;
}

Assistant:

void interpolatetest2() {
	int N,i;
	double ylo,yhi,val,out;

	double tablei[4] = { 0.216, 0.176, 0.146, 0.119};
	double tablet[4] = {0.01, 0.025, 0.05, 0.10};
	int pos[4] = {0,0,0,0};

	val = 0.059;
	N = 4;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);

	sort1d_ascending(tablei,4,pos);

	for(i = 0; i < 4; ++i) {
		printf(" %d %g %g",pos[i],tablei[i],tablei[pos[i]]);
	}



}